

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O0

void __thiscall
HighsPseudocost::addInferenceObservation
          (HighsPseudocost *this,HighsInt col,HighsInt ninferences,bool upbranch)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double d;
  
  *(long *)(in_RDI + 0x148) = *(long *)(in_RDI + 0x148) + 1;
  *(double *)(in_RDI + 0x138) =
       ((double)in_EDX - *(double *)(in_RDI + 0x138)) / (double)*(long *)(in_RDI + 0x148) +
       *(double *)(in_RDI + 0x138);
  if ((in_CL & 1) == 0) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78),(long)in_ESI);
    dVar1 = *pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa8),(long)in_ESI);
    *pvVar4 = *pvVar4 + 1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa8),(long)in_ESI);
    iVar2 = *pvVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78),(long)in_ESI);
    *pvVar3 = ((double)in_EDX - dVar1) / (double)iVar2 + *pvVar3;
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),(long)in_ESI);
    dVar1 = *pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x90),(long)in_ESI);
    *pvVar4 = *pvVar4 + 1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x90),(long)in_ESI);
    iVar2 = *pvVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),(long)in_ESI);
    *pvVar3 = ((double)in_EDX - dVar1) / (double)iVar2 + *pvVar3;
  }
  return;
}

Assistant:

void addInferenceObservation(HighsInt col, HighsInt ninferences,
                               bool upbranch) {
    double d = ninferences - inferences_total;
    ++ninferencestotal;
    inferences_total += d / static_cast<double>(ninferencestotal);
    if (upbranch) {
      d = ninferences - inferencesup[col];
      ninferencesup[col] += 1;
      inferencesup[col] += d / ninferencesup[col];
    } else {
      d = ninferences - inferencesdown[col];
      ninferencesdown[col] += 1;
      inferencesdown[col] += d / ninferencesdown[col];
    }
  }